

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwTerminate(void)

{
  _GLFWmonitor *monitor_00;
  _GLFWmonitor *monitor;
  int i;
  
  if (_glfwInitialized != '\0') {
    memset(&_glfw.callbacks,0,8);
    while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
      glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
    }
    while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
      glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
    }
    for (monitor._4_4_ = 0; monitor._4_4_ < _glfw.monitorCount; monitor._4_4_ = monitor._4_4_ + 1) {
      monitor_00 = _glfw.monitors[monitor._4_4_];
      if ((monitor_00->originalRamp).size != 0) {
        _glfwPlatformSetGammaRamp(monitor_00,&monitor_00->originalRamp);
      }
    }
    _glfwFreeMonitors(_glfw.monitors,_glfw.monitorCount);
    _glfw.monitors = (_GLFWmonitor **)0x0;
    _glfw.monitorCount = 0;
    _glfwPlatformTerminate();
    memset(&_glfw,0,0x8b8);
    _glfwInitialized = '\0';
  }
  return;
}

Assistant:

GLFWAPI void glfwTerminate(void)
{
    int i;

    if (!_glfwInitialized)
        return;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfwPlatformSetGammaRamp(monitor, &monitor->originalRamp);
    }

    _glfwFreeMonitors(_glfw.monitors, _glfw.monitorCount);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    _glfwPlatformTerminate();

    memset(&_glfw, 0, sizeof(_glfw));
    _glfwInitialized = GL_FALSE;
}